

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

int Zyx_ManIsUsed3(Zyx_Man_t *p,int m,int n,int i,int j,int k)

{
  int i_00;
  int iVar1;
  int Pos;
  int k_local;
  int j_local;
  int i_local;
  int n_local;
  int m_local;
  Zyx_Man_t *p_local;
  
  i_00 = ((((m * p->pPars->nNodes + n) - p->pPars->nVars) * p->nObjs + i) * p->nObjs + j) * p->nObjs
         + k;
  p->nUsed[0] = p->nUsed[0] + 1;
  if ((((i < n) && (j < n)) && (k < n)) && ((i < j && (j < k)))) {
    iVar1 = Vec_BitEntry(p->vUsed3,i_00);
    if (iVar1 == 0) {
      p->nUsed[1] = p->nUsed[1] + 1;
      Vec_BitWriteEntry(p->vUsed3,i_00,1);
    }
    p_local._4_4_ = (uint)(iVar1 != 0);
    return p_local._4_4_;
  }
  __assert_fail("i < n && j < n && k < n && i < j && j < k",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                ,600,"int Zyx_ManIsUsed3(Zyx_Man_t *, int, int, int, int, int)");
}

Assistant:

static inline int     Zyx_ManIsUsed3( Zyx_Man_t * p, int m, int n, int i, int j, int k )
{
    int Pos = (((m * p->pPars->nNodes + n - p->pPars->nVars) * p->nObjs + i) * p->nObjs + j) * p->nObjs + k;
    p->nUsed[0]++;
    assert( i < n && j < n && k < n && i < j && j < k );
    if ( Vec_BitEntry(p->vUsed3, Pos) )
        return 1;
    p->nUsed[1]++;
    Vec_BitWriteEntry( p->vUsed3, Pos, 1 );
    return 0;
}